

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int parse_defopcode(SymbolTable *sym,List *new)

{
  void *__s;
  uint *puVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  long *plVar5;
  undefined8 uVar6;
  char *__dest;
  long lVar7;
  byte bVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  void *pvVar14;
  ListStruct *pLVar15;
  long *plVar16;
  List *pLVar17;
  List *pLVar18;
  ulong uVar19;
  ulong uVar20;
  anon_union_8_7_0ba269be_for_u *paVar21;
  char *pcVar22;
  long *plVar23;
  uint uVar24;
  uint uVar25;
  List *native;
  ulong uVar26;
  undefined8 *puVar27;
  byte *__src;
  char **ppcVar28;
  bool bVar29;
  undefined8 uStack_8970;
  long local_8968;
  char *bits_to_expand [64] [64];
  char buf [256];
  List *pLStack_528;
  List *code_backup [64];
  int num_bits_to_expand [64];
  ParsedOpcodeInfo info;
  List dummy1;
  List dummy2;
  
  dummy1.cdr = (ListStruct *)0x0;
  dummy1.token.lineno = 0;
  dummy1.token.u = (anon_union_8_7_0ba269be_for_u)(new->token).filename;
  dummy1.token.filename = (char *)(new->token).lineno;
  dummy1.car = (ListStruct *)CONCAT44((int)((ulong)*(undefined8 *)&new->token >> 0x20),0x48);
  dummy1.token._0_8_ = anon_var_dwarf_117c;
  info._312_8_ = new;
  if (((new->token).type - TOK_IDENTIFIER < 2) && ((new->token).u.string != (char *)0x0)) {
    uStack_8970 = 0x106d59;
    reduce((List *)&dummy1.token.lineno,sym,0);
    iVar10 = 1;
    if (preprocess_only == FALSE) {
      pLVar17 = (List *)**(undefined8 **)(*(long *)info._312_8_ + 8);
      uStack_8970 = 0x106d8a;
      iVar10 = list_length((List *)&info.dont_postincdec_unexpanded);
      uStack_8970 = 0x106d95;
      iVar11 = list_length(pLVar17);
      if (iVar11 == 4) {
        if (iVar10 < 0x44) {
          uStack_8970 = 0x106e15;
          memset(num_bits_to_expand + 0x3e,0,0x140);
          num_bits_to_expand._248_8_ = *(undefined8 *)(info._312_8_ + 0x18);
          info.name._0_4_ = *(undefined4 *)&(pLVar17->token).u;
          info._8_8_ = pLVar17->cdr;
          info.amode = ((ListStruct *)info._8_8_)->cdr;
          if (((info.amode)->token).type == TOK_LIST) {
            pLVar15 = (info.amode)->car;
            if (pLVar15 != (ListStruct *)0x0) {
              do {
                switch((pLVar15->token).type) {
                case TOK_ENDS_BLOCK:
                  info.cc_variant._0_4_ = 1;
                  break;
                case TOK_DONT_POSTINCDEC_UNEXPANDED:
                  info.ends_block = TRUE;
                  break;
                case TOK_NEXT_BLOCK_DYNAMIC:
                  info.cc_variant._4_4_ = 1;
                  break;
                case TOK_SKIP_TWO_OPERAND_WORDS:
                  info.next_block_dynamic = 2;
                  break;
                case TOK_SKIP_FOUR_OPERAND_WORDS:
                case TOK_SKIP_ONE_POINTER:
                  info.next_block_dynamic = 4;
                  break;
                case TOK_SKIP_TWO_POINTERS:
                  info.next_block_dynamic = 8;
                  break;
                default:
                  uStack_8970 = 0x106ea1;
                  pcVar22 = unparse_token(&pLVar15->token,(char *)(bits_to_expand[0x3f] + 0x3f));
                  uStack_8970 = 0x106eb1;
                  parse_error(pLVar15,"Unknown misc flag: %s",pcVar22);
                }
                pLVar15 = pLVar15->cdr;
              } while (pLVar15 != (ListStruct *)0x0);
            }
          }
          else {
            uStack_8970 = 0x106efd;
            parse_error(info.amode,"Expecting a list of misc flags!\n");
          }
          info.misc_flags = (List *)((ulong)info.misc_flags & 0xffffffffffffff00);
          pLVar17 = pLVar17->cdr->cdr->cdr;
          if ((pLVar17->token).type == TOK_LIST) {
            for (pLVar15 = pLVar17->car->cdr; pLVar15 != (ListStruct *)0x0; pLVar15 = pLVar15->cdr)
            {
              uStack_8970 = 0x106f34;
              strcat((char *)&info.misc_flags,(pLVar15->token).u.string);
            }
          }
          else {
            uStack_8970 = 0x106f4f;
            parse_error(pLVar17,"Expecting explicit list of opcode bits.\n");
            info.misc_flags = (List *)0x3030303030303030;
            builtin_strncpy(info.opcode_bits,"00000000",9);
          }
          uStack_8970 = 0x106f71;
          sVar12 = strlen((char *)&info.misc_flags);
          if ((sVar12 & 0xf) != 0) {
            uStack_8970 = 0x106f86;
            parse_error(pLVar17,"Not a multiple of 16 opcode bits.\n");
            info.misc_flags = (List *)0x3030303030303030;
            builtin_strncpy(info.opcode_bits,"00000000",9);
          }
          info.opcode_bits[0x100] = '\0';
          info._289_7_ = 0;
          lVar13 = (long)(int)(iVar10 - 3U);
          uVar20 = lVar13 * 0x28 + 0x27U & 0xfffffffffffffff0;
          lVar7 = -uVar20;
          *(long *)((long)&local_8968 - uVar20) = lVar13 * 0x28 + 0x18;
          *(undefined8 *)((long)bits_to_expand + lVar7) = 0x940504fe;
          *(undefined4 *)((long)bits_to_expand + lVar13 * 0x28 + lVar7 + 0xc) = 0x595141ee;
          __s = (void *)((long)bits_to_expand + lVar7 + 8);
          uVar24 = 0;
          *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107000;
          memset(__s,0,lVar13 * 0x28);
          info._288_8_ = __s;
          if (3 < iVar10) {
            plVar23 = *(long **)info._312_8_;
            ppcVar28 = bits_to_expand[(ulong)(iVar10 - 4) - 1] + 0x3f;
            uVar20 = (ulong)(iVar10 - 4);
            uVar25 = 0;
            do {
              plVar23 = (long *)*plVar23;
              if (uVar20 != 0) {
                pvVar14 = (void *)((long)__s + uVar20 * 0x28);
                *(void **)((long)pvVar14 + -8) = pvVar14;
              }
              puVar27 = *(undefined8 **)plVar23[1];
              pcVar22 = (char *)puVar27[3];
              *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107082;
              sVar12 = strlen(pcVar22);
              if (sVar12 != 5) {
                pLVar17 = (List *)*puVar27;
                *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107099;
                parse_error(pLVar17,"Need exactly five characters in cc bits specification.\n");
                pcVar22 = "-----";
              }
              puVar1 = (uint *)((long)__s + uVar20 * 0x28);
              lVar13 = 0;
              do {
                uVar24 = 0xb;
                do {
                  if (parse_defopcode::cc_bit_info[uVar24].character == pcVar22[4 - lVar13]) {
                    bVar2 = parse_defopcode::cc_bit_info[uVar24].field_0x1;
                    bVar8 = (byte)lVar13;
                    uVar4 = *puVar1;
                    *puVar1 = (((bVar2 >> 3 & 1) << (bVar8 & 0x1f)) << 0x14 | uVar4) & 0x1f00000 |
                              (((bVar2 >> 2 & 1) << (bVar8 & 0x1f)) << 0xf | uVar4) & 0xf8000 |
                              ((bVar2 & 1) << (bVar8 & 0x1f) | uVar4) & 0xfe007c1f |
                              (((bVar2 >> 1 & 1) << (bVar8 & 0x1f)) << 5 | uVar4) & 0x3e0;
                    if (-1 < (int)uVar24) goto LAB_00107164;
                    break;
                  }
                  bVar29 = uVar24 != 0;
                  uVar24 = uVar24 - 1;
                } while (bVar29);
                pLVar17 = *(List **)plVar23[1];
                cVar3 = pcVar22[4 - lVar13];
                *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107164;
                parse_error(pLVar17,"Unknown character \'%c\' in cc bit specification.\n",
                            (ulong)(uint)(int)cVar3);
LAB_00107164:
                lVar13 = lVar13 + 1;
              } while (lVar13 != 5);
              pLVar17 = (List *)**(undefined8 **)plVar23[1];
              pcVar22 = (pLVar17->token).u.string;
              *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x10718b;
              sVar12 = strlen(pcVar22);
              if (sVar12 != 5) {
                *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x1071a2;
                parse_error(pLVar17,"Need exactly five characters in cc bits specification.\n");
                pcVar22 = "-----";
              }
              pcVar22 = pcVar22 + 4;
              lVar13 = 0;
              do {
                cVar3 = *pcVar22;
                *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x1071c8;
                pvVar14 = memchr("-CNVXZ",(int)cVar3,7);
                if (pvVar14 == (void *)0x0) {
                  pLVar17 = (List *)**(undefined8 **)plVar23[1];
                  *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x1071ec;
                  parse_error(pLVar17,
                              "Illegal character \'%c\' in cc bits needed specification.  Must be one of -,C,N,V,X,Z.\n"
                              ,(ulong)(uint)(int)cVar3);
                }
                *puVar1 = *puVar1 | ((uint)(*pcVar22 != '-') << ((byte)lVar13 & 0x1f) & 0x1f) << 10;
                lVar13 = lVar13 + 1;
                pcVar22 = pcVar22 + -1;
              } while (lVar13 != 5);
              num_bits_to_expand[uVar20 - 2] = 0;
              pLVar17 = *(List **)(*(long *)**(undefined8 **)plVar23[1] + 8);
              if ((pLVar17->token).type == TOK_EXPLICIT_LIST) {
                pLVar15 = pLVar17->cdr;
                if (pLVar15 != (ListStruct *)0x0) {
                  uVar19 = (ulong)num_bits_to_expand[uVar20 - 2];
                  paVar21 = (anon_union_8_7_0ba269be_for_u *)(ppcVar28 + uVar19);
                  do {
                    *paVar21 = (pLVar15->token).u;
                    pLVar15 = pLVar15->cdr;
                    paVar21 = paVar21 + 1;
                    uVar24 = (int)uVar19 + 1;
                    uVar19 = (ulong)uVar24;
                  } while (pLVar15 != (ListStruct *)0x0);
                  num_bits_to_expand[uVar20 - 2] = uVar24;
                }
              }
              else {
                *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107280;
                parse_error(pLVar17,"Expecting a list of bit pattern strings.\n");
              }
              iVar11 = num_bits_to_expand[uVar20 - 2];
              num_bits_to_expand[uVar20 - 2] = iVar11 + 1U;
              uVar24 = iVar11 + 1U;
              if (iVar11 < (int)uVar25) {
                uVar24 = uVar25;
              }
              bits_to_expand[uVar20 - 1][(long)iVar11 + 0x3f] = "----------------";
              plVar16 = *(long **)**(undefined8 **)plVar23[1];
              plVar5 = (long *)*plVar16;
              *(long **)((long)bits_to_expand + uVar20 * 0x28 + lVar7 + 0x18) = plVar5;
              if ((((plVar5 != (long *)0x0) && (pLVar17 = (List *)plVar5[1], pLVar17 != (List *)0x0)
                   ) && ((pLVar17->token).type == TOK_NATIVE_CODE)) &&
                 (plVar16 = plVar5, (pLVar17->cdr->token).type != TOK_QUOTED_STRING)) {
                *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107305;
                parse_error(pLVar17,"Faulty native code specifier.");
              }
              *(long *)(puVar1 + 4) = *plVar16;
              puVar1[6] = 0;
              puVar1[7] = 0;
              ppcVar28 = ppcVar28 + -0x40;
              bVar29 = 0 < (long)uVar20;
              uVar20 = uVar20 - 1;
              uVar25 = uVar24;
            } while (bVar29);
          }
          uVar20 = (ulong)(iVar10 - 3U);
          if (3 < iVar10) {
            lVar13 = 0;
            do {
              pLVar17 = *(List **)((long)bits_to_expand + lVar13 + lVar7 + 0x18);
              *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107368;
              verify_fields_exist((char *)&info.misc_flags,pLVar17);
              lVar13 = lVar13 + 0x28;
            } while (uVar20 * 0x28 != lVar13);
          }
          if (3 < iVar10) {
            puVar27 = (undefined8 *)((long)bits_to_expand + lVar7 + 0x18);
            uVar19 = 0;
            do {
              *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x10738d;
              pvVar14 = malloc(0x11);
              puVar27[-1] = pvVar14;
              code_backup[uVar19 - 1] = (List *)*puVar27;
              uVar19 = uVar19 + 1;
              puVar27 = puVar27 + 5;
            } while (uVar20 != uVar19);
          }
          if (0 < (int)uVar24) {
            uVar19 = 0;
            do {
              uVar9 = info._8_8_;
              uVar6 = *(undefined8 *)info._8_8_;
              *(undefined8 *)info._8_8_ = 0;
              if (3 < iVar10) {
                uVar26 = 0;
                puVar27 = (undefined8 *)((long)bits_to_expand + lVar7 + 0x18);
                do {
                  pLVar17 = code_backup[uVar26 - 1];
                  *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x1073fa;
                  pLVar17 = copy_list(pLVar17);
                  *puVar27 = pLVar17;
                  uVar26 = uVar26 + 1;
                  puVar27 = puVar27 + 5;
                } while (uVar20 != uVar26);
              }
              if (3 < iVar10) {
                uVar26 = 0;
LAB_00107415:
                pcVar22 = "----------------";
                if ((long)uVar19 < (long)num_bits_to_expand[uVar26 - 2]) {
                  pcVar22 = bits_to_expand[uVar26 - 1][uVar19 + 0x3f];
                }
                puVar27 = (undefined8 *)((long)__s + uVar26 * 0x28 + 8);
                __dest = (char *)*puVar27;
                *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107455;
                strcpy(__dest,pcVar22);
                pcVar22 = buf + uVar26 * 0x11 + -8;
                __src = (byte *)*puVar27;
                *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107478;
                strcpy(pcVar22,(char *)__src);
                do {
                  if (*pcVar22 == '-') {
                    *pcVar22 = 'x';
                  }
                  else if (*pcVar22 == '\0') goto LAB_00107495;
                  pcVar22 = pcVar22 + 1;
                } while( true );
              }
LAB_001074b7:
              if (3 < iVar10) {
                ppcVar28 = bits_to_expand[0x3f] + 0x3f;
                uVar26 = uVar20;
                do {
                  *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x1074d6;
                  iVar11 = strcmp((char *)ppcVar28,"xxxxxxxxxxxxxxxx");
                  if (iVar11 != 0) {
                    *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x1074df;
                    pLVar17 = alloc_list();
                    (pLVar17->token).type = TOK_LIST;
                    *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x1074ee;
                    pLVar18 = alloc_list();
                    pLVar17->car = pLVar18;
                    (pLVar18->token).type = TOK_INTERSECT;
                    (pLVar18->token).u.string = "intersect";
                    *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x107509;
                    pLVar18 = alloc_list();
                    pLVar17->car->cdr = pLVar18;
                    (pLVar18->token).type = TOK_QUOTED_STRING;
                    (pLVar18->token).u.string = (char *)ppcVar28;
                    pLVar17->car->cdr->cdr = (ListStruct *)info._8_8_;
                    info._8_8_ = pLVar17;
                  }
                  ppcVar28 = (char **)((long)ppcVar28 + 0x11);
                  uVar26 = uVar26 - 1;
                } while (uVar26 != 0);
              }
              *(undefined8 *)((long)&uStack_8970 + lVar7) = 0x10754c;
              generate_opcode((ParsedOpcodeInfo *)(num_bits_to_expand + 0x3e),sym);
              info._8_8_ = uVar9;
              *(undefined8 *)uVar9 = uVar6;
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar24);
          }
          if (*(long *)((long)bits_to_expand + lVar7) == 0x940504fe) {
            lVar13 = *(long *)((long)&local_8968 + lVar7);
            if (*(char *)((long)&uStack_8970 + lVar13 + lVar7 + 4) == -0x12) {
              if (*(char *)((long)&uStack_8970 + lVar13 + lVar7 + 5) == 'A') {
                if (*(char *)((long)&uStack_8970 + lVar13 + lVar7 + 6) == 'Q') {
                  if (*(char *)((long)&uStack_8970 + lVar13 + lVar7 + 7) == 'Y') {
                    return 1;
                  }
                  pcVar22 = "___tempptr[___newsize-1] == FIREWALL_STOP_3";
                }
                else {
                  pcVar22 = "___tempptr[___newsize-2] == FIREWALL_STOP_2";
                }
              }
              else {
                pcVar22 = "___tempptr[___newsize-3] == FIREWALL_STOP_1";
              }
            }
            else {
              pcVar22 = "___tempptr[___newsize-4] == FIREWALL_STOP_0";
            }
          }
          else {
            pcVar22 = "((long *)___tempptr)[1] == FIREWALL_START";
          }
          *(code **)((long)&uStack_8970 + lVar7) = string_to_list;
          __assert_fail(pcVar22,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                        ,0x1fc,"int parse_defopcode(SymbolTable *, List *)");
        }
        pcVar22 = 
        "Error: too many variants.  Only %d allowed.  To raise, change MAX_VARIANTS in defopcode.h.\n"
        ;
        uVar20 = 0x40;
      }
      else {
        uStack_8970 = 0x106de0;
        uVar24 = list_length(pLVar17);
        pcVar22 = "Missing arguments; should be 4, found %d\n";
        uVar20 = (ulong)uVar24;
      }
      uStack_8970 = 0x106df3;
      parse_error(pLVar17,pcVar22,uVar20);
      iVar10 = 0;
    }
  }
  else {
    iVar10 = 0;
    uStack_8970 = 0x106dc7;
    parse_error(new,"Invalid opcode name.  Ignoring...\n");
  }
  return iVar10;
LAB_00107495:
  if (*__src - 0x30 < 2) {
    *__src = 0x78;
  }
  else if (*__src == 0) goto code_r0x001074ab;
  __src = __src + 1;
  goto LAB_00107495;
code_r0x001074ab:
  uVar26 = uVar26 + 1;
  if (uVar26 == uVar20) goto LAB_001074b7;
  goto LAB_00107415;
}

Assistant:

static int
parse_defopcode (SymbolTable *sym, List *new)
{
  const char *name = NULL;
  List dummy1 = { /* new */ 0, NULL, { /* new->token */ 0 } };
  List dummy2 = { NULL, /* &dummy1 */ 0, { /* new->token */ 0 } };
  SAFE_DECL ();

  dummy1.cdr = new;
  dummy1.token = new->token;
  dummy2.car = &dummy1;
  dummy2.token = new->token;

  dummy1.token.type = TOK_DEFOPCODE;
  dummy1.token.u.string = "defopcode";
  dummy2.token.type = TOK_LIST;
  dummy2.token.u.string = NULL;

  if (new->token.type == TOK_QUOTED_STRING
      || new->token.type == TOK_IDENTIFIER)
    name = new->token.u.string;

  /* Make sure the opcode name is legitimate. */
  if (name == NULL)
    {
      parse_error (new, "Invalid opcode name.  Ignoring...\n");
      return 0;
    }

  /* Perform initial macro substitutions. */
  reduce (&dummy2, sym, 0);

  /* Generate the opcode. */
  if (!preprocess_only)
    {
      ParsedOpcodeInfo info;
      List *l = CDR (CADDAR (&dummy2)), *err;
      CCVariant *var;
      int num_variants;
      List *code_backup[MAX_VARIANTS];
      const char *bits_to_expand[MAX_VARIANTS][MAX_VARIANTS];
      int num_bits_to_expand[MAX_VARIANTS];
      int max_num_bits_to_expand = 0;
      int i;

      num_variants = list_length (&dummy1) - 3;
      if (list_length (l) != 4)
	{
	  parse_error (l, "Missing arguments; should be 4, found %d\n",
		       list_length (l));
	  return 0;
	}

      if (num_variants > MAX_VARIANTS)
	{
	  parse_error (l, "Error: too many variants.  Only %d allowed.  To "
		       "raise, change MAX_VARIANTS in defopcode.h.\n",
		       MAX_VARIANTS);
	  return 0;
	}

      /* Parse in the instruction information. */
      memset (&info, 0, sizeof info);
      info.name = CDAR (&dummy2)->token.u.string;
      info.cpu = l->token.u.n;
      info.amode = CDR (l);
      info.misc_flags = CDDR (l);

      if (info.misc_flags->token.type != TOK_LIST)
	parse_error (info.misc_flags, "Expecting a list of misc flags!\n");
      else
	{
	  List *ls;
	  for (ls = info.misc_flags->car; ls != NULL; ls = ls->cdr)
	    {
	      char buf[256];

	      switch (ls->token.type) {
	      case TOK_ENDS_BLOCK:
		info.ends_block = TRUE;
		break;
	      case TOK_DONT_POSTINCDEC_UNEXPANDED:
		info.dont_postincdec_unexpanded = TRUE;
		break;
	      case TOK_NEXT_BLOCK_DYNAMIC:
		info.next_block_dynamic = TRUE;
		break;
	      case TOK_SKIP_TWO_OPERAND_WORDS:
		info.operand_words_to_skip = 2;
		break;
	      case TOK_SKIP_FOUR_OPERAND_WORDS:
		info.operand_words_to_skip = 4;
		break;
	      case TOK_SKIP_ONE_POINTER:
	        info.operand_words_to_skip = PTR_WORDS;
	        break;
	      case TOK_SKIP_TWO_POINTERS:
	        info.operand_words_to_skip = PTR_WORDS * 2;
	        break;
	      default:
		parse_error (ls, "Unknown misc flag: %s",
			     unparse_token (&ls->token, buf));
		break;
	      }
	    }
	}

      info.opcode_bits[0] = '\0';
      err = CDDDR (l);  /* For later, in case we need it. */
      if (CDDDR (l)->token.type != TOK_LIST)
	{
	  parse_error (CDDDR (l), "Expecting explicit list of opcode bits.\n");
	  strcpy (info.opcode_bits, "0000000000000000");
	}
      else
	for (l = CDR (CADDDR (l)); l != NULL; l = l->cdr)
	  {
	    if (0 && strlen (l->token.u.string) != 16)
	      {
		/* This seems a little harsh... */
		parse_error (l, "Need exactly 16 characters in each bit "
			     "pattern specification string, found %d.\n",
			     strlen (l->token.u.string));
		strcat (info.opcode_bits, "0000000000000000");
	      }
	    else
	      strcat (info.opcode_bits, l->token.u.string);
	  }
      if (strlen (info.opcode_bits) % 16)
	{
	  parse_error (err, "Not a multiple of 16 opcode bits.\n");
	  strcpy (info.opcode_bits, "0000000000000000");
	}
      info.cc_variant = NULL;

      /* Parse the information for the cc variants. */
      var = (CCVariant *) SAFE_alloca (num_variants * sizeof (CCVariant));
      memset (var, 0, num_variants * sizeof (CCVariant));
      info.cc_variant = var;

      /* Loop through and parse each cc variant. */
      for (i = num_variants - 1, l = CDDDR (&dummy1); i >= 0; i--, l = l->cdr)
	{
	  static const struct {
	    char character;
	    unsigned char cc_may_set:1;
	    unsigned char cc_may_not_set:1;
	    unsigned char cc_to_known_value:1;
	    unsigned char cc_known_values:1;
	  } cc_bit_info[] = {
	    { '0', 1, 0, 1, 0 },    /* 0  ->  always force cc bit to 0.    */
	    { '1', 1, 0, 1, 1 },    /* 1  ->  always force cc bit to 1.    */
	    { 'C', 1, 0, 0, 0 },    /* Any letter means will always set    */
	    { 'N', 1, 0, 0, 0 },    /*     cc bit to either 0 or 1, but    */
	    { 'V', 1, 0, 0, 0 },    /*     we can't determine which at     */
	    { 'X', 1, 0, 0, 0 },    /*     compile time.                   */
	    { 'Z', 1, 0, 0, 0 },    /*                                     */
	    { '-', 0, 1, 0, 0 },    /* -  ->  cc bit always unchanged.     */
	    { '>', 1, 1, 0, 0 },    /* >  ->  cc set to 1 or unchanged.    */
	    { '<', 1, 1, 0, 0 },    /* <  ->  cc set to 0 or unchanged.    */
	    { '?', 1, 0, 0, 0 },    /* ?  ->  cc bit undefined.            */
	    { '%', 1, 1, 0, 0 },    /* %  ->  cc might change, might not.  */
	  };
	  int guess, bit;
	  const char *b;
	  List *bte;
	  
	  /* Insert them in reverse order. */
	  if (i > 0)
	    var[i - 1].next = &var[i];

	  /* Parse the cc bits set specs. */
	  b = (CDAR (l))->token.u.string;
	  if (strlen (b) != 5)
	    {
	      parse_error (CDDAR (l), "Need exactly five characters in "
			   "cc bits specification.\n");
	      b = "-----";
	    }
			 
	  for (bit = 0; bit < 5; bit++)
	    {
	      for (guess = sizeof cc_bit_info / sizeof cc_bit_info[0] - 1;
		   guess >= 0; guess--)
		if (cc_bit_info[guess].character == b[4 - bit])
		  {
		    var[i].cc_may_set |= cc_bit_info[guess].cc_may_set << bit;
		    var[i].cc_may_not_set
		      |= cc_bit_info[guess].cc_may_not_set << bit;
		    var[i].cc_to_known_value
		      |= cc_bit_info[guess].cc_to_known_value << bit;
		    var[i].cc_known_values
		      |= cc_bit_info[guess].cc_known_values << bit;
		    break;
		  }
	      if (guess < 0)
		parse_error (CDAR (l), "Unknown character '%c' in cc bit "
			     "specification.\n", b[4 - bit]);
	    }

	  /* Parse the cc bits needed specs. */
	  b = (CDDAR (l))->token.u.string;
	  if (strlen (b) != 5)
	    {
	      parse_error (CDDAR (l), "Need exactly five characters in "
			   "cc bits specification.\n");
	      b = "-----";
	    }
	  
	  for (bit = 0; bit < 5; bit++)
	    {
	      if (strchr ("-CNVXZ", b[4 - bit]) == NULL)
		parse_error (CDDAR (l), "Illegal character '%c' in cc bits "
			     "needed specification.  Must be one of "
			     "-,C,N,V,X,Z.\n",
			     b[4 - bit]);
	      var[i].cc_needed |= (b[4 - bit] != '-') << bit;
	    }


	  /* Fetch all of the bits_to_expand strings into an array.
	   * Terminate the list provided by the user with "----------------"
	   * so we guarantee that all legal bit patterns get code generated
	   * for them.
	   */
	  num_bits_to_expand[i] = 0;
	  bte = CADDR (CDAR (l));
	  if (bte->token.type != TOK_EXPLICIT_LIST)
	    parse_error (bte, "Expecting a list of bit pattern strings.\n");
	  else
	    {
	      for (bte = bte->cdr; bte != NULL; bte = bte->cdr)
		bits_to_expand[i][num_bits_to_expand[i]++]
		  = bte->token.u.string;
	    }
	  bits_to_expand[i][num_bits_to_expand[i]++]
	    = "----------------";
	  if (num_bits_to_expand[i] > max_num_bits_to_expand)
	    max_num_bits_to_expand = num_bits_to_expand[i];
	  var[i].code = CDDR (CDDAR (l));

	  {
	    List *native = CDDR (CDDAR (l));
	    if (native != NULL && CAR (native) != NULL
		&& (CAR (native))->token.type == TOK_NATIVE_CODE)
	      {
		if ((CDAR (native))->token.type != TOK_QUOTED_STRING)
		  parse_error (CAR (native), "Faulty native code specifier.");
#ifdef GENERATE_NATIVE_CODE

		{
		  char buf[1024];
		  List *xx;

		  buf[0] = '\0';
		  for (xx = CDAR (native); xx != NULL; xx = xx->cdr)
		    {
		      if (xx->token.type == TOK_QUOTED_STRING)
			strcat (buf, xx->token.u.string);
		      else
			parse_error (xx, "Expected string here.");
		    }
		  if (buf[0] == '\0' || !strcmp (buf, "none"))
		    var[i].native_code_info = NULL;
		  else
		    var[i].native_code_info = unique_string (buf);
		}
#endif
		var[i].code = native->cdr;
	      }
	    else
	      {
#ifdef GENERATE_NATIVE_CODE
		var[i].native_code_info = NULL;
#endif
		var[i].code = CDDR (CDDAR (l));
	      }
	  }

#ifndef GENERATE_NATIVE_CODE
	  var[i].native_code_info = NULL;
#endif
	}

      /* Verify that all of the fields they specified actually exist. */
      for (i = 0; i < num_variants; i++)
	verify_fields_exist (info.opcode_bits, var[i].code);

      /* Loop through and generate code for each bits_to_expand specified.
       * This is not elegant; originally, only one bits_to_expand string
       * could be specified, and its semantics were more limited than the
       * new, more powerful versions.  To compensate, we will call the
       * lower level routines once for each bits_to_expand string, and
       * modify the legal addressing mode expression to provide us with the
       * new literal bits matching capability of the new bits_to_expand
       * strings.
       */
      
      for (i = 0; i < num_variants; i++)
	{
/*
 * TODO:  FIXME -- I don't like "17" below
 */
	  /* We allocate 17 bytes because we can only expand up to 16
	   * bits, and we have one extra for the terminating 0.
	   */
	  var[i].bits_to_expand = (char *) malloc (17);
	  code_backup[i] = var[i].code;
	}

      for (i = 0; i < max_num_bits_to_expand; i++)
	{
	  char intersect[MAX_VARIANTS][17];
	  List *saved_amode = info.amode;
	  List *old_cdr = info.amode->cdr;
	  int j;
	  
	  info.amode->cdr = NULL;

	  /* Preserve code. */
	  for (j = 0; j < num_variants; j++)
	    var[j].code = copy_list (code_backup[j]);

	  /* Grab all of the bits_to_expand strings. */
	  for (j = 0; j < num_variants; j++)
	    {
	      char *p;
	      strcpy (var[j].bits_to_expand, ((i < num_bits_to_expand[j])
					      ? bits_to_expand[j][i]
					      : "----------------"));
	      
	      /* Generate the intersection string. */
	      strcpy (intersect[j], var[j].bits_to_expand);
	      for (p = intersect[j]; *p != '\0'; p++)
		if (*p == '-')
		  *p = 'x';
	      
	      /* Expand all literal bits by replacing them with 'x'.*/
	      for (p = var[j].bits_to_expand; *p != '\0'; p++)
		if (*p == '0' || *p == '1')
		  *p = 'x';
	    }
	  
	  /* Intersect with all of the literal bits we know about. */
	  for (j = 0; j < num_variants; j++)
	    if (strcmp (intersect[j], "xxxxxxxxxxxxxxxx"))
	      {
		List *isect = alloc_list ();
		isect->token.type = TOK_LIST;
		isect->car = alloc_list ();
		isect->car->token.type = TOK_INTERSECT;
		isect->car->token.u.string = "intersect";
		isect->car->cdr = alloc_list ();
		isect->car->cdr->token.type = TOK_QUOTED_STRING;
		isect->car->cdr->token.u.string = intersect[j];
		isect->car->cdr->cdr = info.amode;
		info.amode = isect;
	      }

	  /* Generate the actual code. */
	  generate_opcode (&info, sym);

	  /* Memory leak here, but who cares? */
	  info.amode = saved_amode;
	  info.amode->cdr = old_cdr;
	}
	ASSERT_SAFE(var);
    }

  return 1;
}